

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O1

void addtobill(obj *obj,boolean ininv,boolean dummy,boolean silent)

{
  uint uVar1;
  obj *poVar2;
  int iVar3;
  monst *mtmp;
  bill_x *pbVar4;
  long amount;
  long lVar5;
  long amount_00;
  char *pcVar6;
  char *pcVar7;
  size_t sVar8;
  char *pcVar9;
  char buf [256];
  char local_138 [264];
  
  if (u.ushops[0] == '\0') {
    return;
  }
  poVar2 = obj->cobj;
  mtmp = shop_keeper(level,u.ushops[0]);
  if (mtmp == (monst *)0x0) {
    return;
  }
  iVar3 = inhishop(mtmp);
  if (iVar3 == 0) {
    return;
  }
  pbVar4 = onbill(obj,mtmp,'\0');
  if (pbVar4 != (bill_x *)0x0) {
    return;
  }
  if ((obj->oclass == '\a') && (obj->oeaten != 0)) {
    return;
  }
  if (*(short *)((long)&mtmp[0x1b].misc_worn_check + 2) == 200) {
    pline("You got that for free!");
    return;
  }
  if (obj->oclass == '\f') {
    costly_gold(obj->ox,obj->oy,(long)obj->quan);
    return;
  }
  if ((obj->field_0x4a & 8) == 0) {
    amount = get_cost(obj,mtmp);
  }
  else {
    amount = 0;
  }
  uVar1 = *(uint *)&obj->field_0x4a;
  if ((uVar1 & 8) != 0 && poVar2 == (obj *)0x0) {
LAB_0023d7b9:
    *(uint *)&obj->field_0x4a = uVar1 & 0xfffffff7;
    return;
  }
  if (poVar2 != (obj *)0x0) {
    if (obj->cobj != (obj *)0x0) {
      lVar5 = contained_cost(obj,mtmp,0,'\0','\0');
      amount_00 = contained_gold(obj);
      if (amount != 0) {
        add_one_tobill(obj,dummy);
      }
      if (lVar5 != 0) {
        bill_box_content(obj,dummy);
      }
      picked_container(obj);
      amount = amount + lVar5;
      if ((amount_00 != 0) && (costly_gold(obj->ox,obj->oy,amount_00), amount == 0)) {
        return;
      }
      if ((*(uint *)&obj->field_0x4a & 8) != 0) {
        *(uint *)&obj->field_0x4a = *(uint *)&obj->field_0x4a & 0xfffffff7;
      }
      goto LAB_0023d741;
    }
    if ((uVar1 & 8) != 0) goto LAB_0023d7b9;
  }
  add_one_tobill(obj,dummy);
LAB_0023d741:
  if ((((*(uint *)&mtmp->field_0x60 >> 0x12 & 1) == 0) || (silent != '\0')) ||
     ((*(uint *)&mtmp->field_0x60 & 0x80000) != 0)) {
    if (silent == '\0') {
      if (amount == 0) {
        pcVar6 = Monnam(mtmp);
        pline("%s does not notice.",pcVar6);
        return;
      }
      pcVar6 = xname(obj);
      pcVar6 = the(pcVar6);
      pcVar7 = currency(amount);
      pcVar9 = "";
      if (1 < obj->quan) {
        pcVar9 = " each";
      }
      pline("The list price of %s is %ld %s%s.",pcVar6,amount,pcVar7,pcVar9);
      return;
    }
  }
  else if (amount == 0) {
    pcVar6 = Monnam(mtmp);
    pcVar7 = xname(obj);
    pcVar7 = the(pcVar7);
    pline("%s has no interest in %s.",pcVar6,pcVar7);
  }
  else {
    builtin_strncpy(local_138,"\"For you, ",0xb);
    if ((mtmp->field_0x62 & 0x40) == 0) {
      sVar8 = strlen(local_138);
      builtin_strncpy(local_138 + sVar8,"scum",5);
    }
    else {
      append_honorific(local_138);
    }
    if (ininv == '\0') {
      pcVar6 = xname(obj);
      pcVar6 = The(pcVar6);
      pcVar7 = currency(amount);
      pcVar9 = "";
      if (1 < obj->quan) {
        pcVar9 = " each";
      }
      pline("%s will cost you %ld %s%s.",pcVar6,amount,pcVar7,pcVar9);
    }
    else {
      iVar3 = obj->quan;
      obj->quan = 1;
      pcVar6 = "for this";
      if (1 < iVar3) {
        pcVar6 = "per";
      }
      pcVar7 = xname(obj);
      pline("%s; only %ld %s %s.\"",local_138,amount,pcVar6,pcVar7);
      obj->quan = iVar3;
    }
  }
  return;
}

Assistant:

void addtobill(struct obj *obj, boolean ininv, boolean dummy, boolean silent)
{
	struct monst *shkp;
	char roomno = *u.ushops;
	long ltmp = 0L, cltmp = 0L, gltmp = 0L;
	boolean container = Has_contents(obj);

	if (!*u.ushops) return;

	if (!(shkp = shop_keeper(level, roomno))) return;

	if (!inhishop(shkp)) return;

	if (/* perhaps we threw it away earlier */
		 onbill(obj, shkp, FALSE) ||
		 (obj->oclass == FOOD_CLASS && obj->oeaten)
	      ) return;

	if (ESHK(shkp)->billct == BILLSZ) {
		pline("You got that for free!");
		return;
	}

	if (obj->oclass == COIN_CLASS) {
		costly_gold(obj->ox, obj->oy, obj->quan);
		return;
	}

	if (!obj->no_charge)
	    ltmp = get_cost(obj, shkp);

	if (obj->no_charge && !container) {
		obj->no_charge = 0;
		return;
	}

	if (container) {
	    if (obj->cobj == NULL) {
		if (obj->no_charge) {
		    obj->no_charge = 0;
		    return;
		} else {
		    add_one_tobill(obj, dummy);
		    goto speak;
		}
	    } else {
		cltmp += contained_cost(obj, shkp, cltmp, FALSE, FALSE);
		gltmp += contained_gold(obj);
	    }

	    if (ltmp) add_one_tobill(obj, dummy);
	    if (cltmp) bill_box_content(obj, dummy);
	    picked_container(obj); /* reset contained obj->no_charge */

	    ltmp += cltmp;

	    if (gltmp) {
		costly_gold(obj->ox, obj->oy, gltmp);
		if (!ltmp) return;
	    }

	    if (obj->no_charge)
		obj->no_charge = 0;

	} else /* i.e., !container */
	    add_one_tobill(obj, dummy);
speak:
	if (shkp->mcanmove && !shkp->msleeping && !silent) {
	    char buf[BUFSZ];

	    if (!ltmp) {
		pline("%s has no interest in %s.", Monnam(shkp),
					     the(xname(obj)));
		return;
	    }
	    strcpy(buf, "\"For you, ");
	    if (ANGRY(shkp)) strcat(buf, "scum");
	    else append_honorific(buf);
	    if (ininv) {
		long quan = obj->quan;
		obj->quan = 1L; /* fool xname() into giving singular */
		pline("%s; only %ld %s %s.\"", buf, ltmp,
			(quan > 1L) ? "per" : "for this", xname(obj));
		obj->quan = quan;
	    } else
		pline("%s will cost you %ld %s%s.",
			The(xname(obj)), ltmp, currency(ltmp),
			(obj->quan > 1L) ? " each" : "");
	} else if (!silent) {
	    if (ltmp) pline("The list price of %s is %ld %s%s.",
				   the(xname(obj)), ltmp, currency(ltmp),
				   (obj->quan > 1L) ? " each" : "");
	    else pline("%s does not notice.", Monnam(shkp));
	}
}